

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

iter_result * __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::last(iter_result *__return_storage_ptr__,
      basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      *this)

{
  byte bVar1;
  undefined1 uVar2;
  byte bVar3;
  uintptr_t uVar4;
  
  bVar3 = this->field_0x8 - 1;
  bVar1 = *(byte *)((long)(this->children)._M_elems + ((ulong)bVar3 - 4));
  uVar4 = basic_node_ptr<unodb::detail::node_header>::tag_ptr((node_header *)this,I4);
  (__return_storage_ptr__->node).tagged_ptr = uVar4;
  __return_storage_ptr__->key_byte = bVar1;
  __return_storage_ptr__->child_index = bVar3;
  uVar2 = this->field_0x7;
  *(key_prefix_data *)&__return_storage_ptr__->prefix =
       (key_prefix_data)*(undefined7 *)&this->field_0x0;
  *(undefined1 *)((long)&__return_storage_ptr__->prefix + 7) = uVar2;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_4::iter_result
  last() noexcept {
    const auto child_index{
        static_cast<std::uint8_t>(this->children_count.load() - 1)};
    const auto key = keys.byte_array[child_index].load();
    return {node_ptr{this, node_type::I4}, key, child_index,
            this->get_key_prefix().get_snapshot()};
  }